

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O2

void __thiscall
optTyped_otherTypeCopyAssignmentNotEmptyForEmpty_Test<mp::opt<bool,_mp::opt_default_policy<bool>_>_>
::optTyped_otherTypeCopyAssignmentNotEmptyForEmpty_Test
          (optTyped_otherTypeCopyAssignmentNotEmptyForEmpty_Test<mp::opt<bool,_mp::opt_default_policy<bool>_>_>
           *this)

{
  anon_unknown.dwarf_df08::optTyped<mp::opt<bool,_mp::opt_default_policy<bool>_>_>::optTyped
            (&this->super_optTyped<mp::opt<bool,_mp::opt_default_policy<bool>_>_>);
  (this->super_optTyped<mp::opt<bool,_mp::opt_default_policy<bool>_>_>).super_Test._vptr_Test =
       (_func_int **)&PTR__Test_001cd4e8;
  return;
}

Assistant:

TYPED_TEST(optTyped, otherTypeCopyAssignmentNotEmptyForEmpty)
{
  using opt_type = typename TestFixture::type;
  using other_opt_type = opt<typename TestFixture::traits::other_type, typename TestFixture::traits::other_policy_type>;
  other_opt_type o1{this->other_value_1};
  opt_type o2;
  o2 = o1;
  EXPECT_TRUE(o1);
  EXPECT_TRUE(o1.has_value());
  EXPECT_EQ(this->value_1, *o1);
  EXPECT_EQ(this->value_1, o1.value());
  EXPECT_EQ(this->value_1, o1.value_or(this->other_value_2));
  EXPECT_TRUE(o2);
  EXPECT_TRUE(o2.has_value());
  EXPECT_EQ(this->value_1, *o2);
  EXPECT_EQ(this->value_1, o2.value());
  EXPECT_EQ(this->value_1, o2.value_or(this->value_2));
}